

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

pair<wasm::Name,_wasm::Name> * __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::pop
          (pair<wasm::Name,_wasm::Name> *__return_storage_ptr__,
          UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *this)

{
  bool bVar1;
  reference pvVar2;
  mapped_type *pmVar3;
  UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *this_local;
  
  do {
    bVar1 = empty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/unique_deferring_queue.h"
                    ,0x34,
                    "T wasm::UniqueDeferredQueue<std::pair<wasm::Name, wasm::Name>>::pop() [T = std::pair<wasm::Name, wasm::Name>]"
                   );
    }
    pvVar2 = std::
             queue<std::pair<wasm::Name,_wasm::Name>,_std::deque<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>_>
             ::front(&this->data);
    (__return_storage_ptr__->first).super_IString.str._M_len =
         (pvVar2->first).super_IString.str._M_len;
    (__return_storage_ptr__->first).super_IString.str._M_str =
         (pvVar2->first).super_IString.str._M_str;
    (__return_storage_ptr__->second).super_IString.str._M_len =
         (pvVar2->second).super_IString.str._M_len;
    (__return_storage_ptr__->second).super_IString.str._M_str =
         (pvVar2->second).super_IString.str._M_str;
    pmVar3 = std::
             unordered_map<std::pair<wasm::Name,_wasm::Name>,_unsigned_long,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>_>
             ::operator[](&this->count,__return_storage_ptr__);
    *pmVar3 = *pmVar3 - 1;
    std::
    queue<std::pair<wasm::Name,_wasm::Name>,_std::deque<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>_>
    ::pop(&this->data);
    pmVar3 = std::
             unordered_map<std::pair<wasm::Name,_wasm::Name>,_unsigned_long,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>_>
             ::operator[](&this->count,__return_storage_ptr__);
  } while (*pmVar3 != 0);
  return __return_storage_ptr__;
}

Assistant:

T pop() {
    while (1) {
      assert(!empty());
      T item = data.front();
      count[item]--;
      data.pop();
      if (count[item] == 0) {
        return item;
      }
      // skip this one, keep going
    }
  }